

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O0

void __thiscall
IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::IntervalTree
          (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this,intervalVector *ivals,
          size_t depth,size_t minbucket,unsigned_long leftextent,unsigned_long rightextent,
          size_t maxbucket)

{
  bool bVar1;
  size_t depth_00;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  iterator __first;
  iterator __last;
  reference puVar5;
  reference pvVar6;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *pIVar7;
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  local_148;
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  local_140;
  reference local_138;
  interval *interval;
  __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
  local_128;
  __normal_iterator<const_Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
  local_120;
  const_iterator i;
  intervalVector rights;
  intervalVector lefts;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
  local_c0;
  __normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
  local_b8;
  undefined1 local_b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> stops;
  unsigned_long centerp;
  unsigned_long rightp;
  unsigned_long leftp;
  IntervalStartSorter<std::shared_ptr<BindingSite>,_unsigned_long> intervalStartSorter;
  unsigned_long rightextent_local;
  unsigned_long leftextent_local;
  size_t minbucket_local;
  size_t depth_local;
  intervalVector *ivals_local;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this_local;
  
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::vector(&this->intervals);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>,void>
            ((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&this->left,(nullptr_t)0x0);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>,void>
            ((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&this->right,(nullptr_t)0x0);
  depth_00 = depth - 1;
  if ((depth_00 == 0) ||
     ((sVar2 = std::
               vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ::size(ivals), sVar2 < minbucket &&
      (sVar2 = std::
               vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ::size(ivals), sVar2 < maxbucket)))) {
    iVar3 = std::
            vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ::begin(ivals);
    iVar4 = std::
            vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ::end(ivals);
    std::
    sort<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>,IntervalStartSorter<std::shared_ptr<BindingSite>,unsigned_long>>
              (iVar3._M_current,iVar4._M_current);
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::operator=(&this->intervals,ivals);
  }
  else {
    if ((leftextent == 0) && (rightextent == 0)) {
      iVar3 = std::
              vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ::begin(ivals);
      iVar4 = std::
              vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ::end(ivals);
      std::
      sort<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>,IntervalStartSorter<std::shared_ptr<BindingSite>,unsigned_long>>
                (iVar3._M_current,iVar4._M_current);
    }
    stops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    centerp = rightextent;
    rightp = leftextent;
    if ((leftextent == 0) && (rightextent == 0)) {
      pvVar6 = std::
               vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ::front(ivals);
      rightp = pvVar6->start;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      sVar2 = std::
              vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ::size(ivals);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,sVar2);
      local_b8._M_current =
           (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
           std::
           vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ::begin(ivals);
      local_c0._M_current =
           (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
           std::
           vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ::end(ivals);
      local_c8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      local_d0 = (unsigned_long *)
                 std::
                 transform<__gnu_cxx::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long(*)(Interval<std::shared_ptr<BindingSite>,unsigned_long>const&)>
                           (local_b8,local_c0,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_c8,intervalStop<std::shared_ptr<BindingSite>,unsigned_long>);
      __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      local_d8 = std::
                 max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                           (__first._M_current,__last._M_current);
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_d8);
      centerp = *puVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    }
    sVar2 = std::
            vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ::size(ivals);
    pvVar6 = std::
             vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ::at(ivals,sVar2 >> 1);
    stops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pvVar6->start;
    this->center = (unsigned_long)
                   stops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              *)&rights.
                 super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              *)&i);
    local_128._M_current =
         (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)
         std::
         vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
         ::begin(ivals);
    __gnu_cxx::
    __normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>const*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>
    ::__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>*>
              ((__normal_iterator<Interval<std::shared_ptr<BindingSite>,unsigned_long>const*,std::vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>>
                *)&local_120,&local_128);
    while( true ) {
      interval = (interval *)
                 std::
                 vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 ::end(ivals);
      bVar1 = __gnu_cxx::operator!=
                        (&local_120,
                         (__normal_iterator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                          *)&interval);
      if (!bVar1) break;
      local_138 = __gnu_cxx::
                  __normal_iterator<const_Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
                  ::operator*(&local_120);
      if (local_138->stop < this->center) {
        std::
        vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ::push_back((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)&rights.
                        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_138);
      }
      else if (this->center < local_138->start) {
        std::
        vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ::push_back((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)&i,local_138);
      }
      else {
        std::
        vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
        ::push_back(&this->intervals,local_138);
      }
      __gnu_cxx::
      __normal_iterator<const_Interval<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>_>
      ::operator++(&local_120);
    }
    bVar1 = std::
            vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ::empty((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)&rights.
                        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      pIVar7 = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)operator_new(0x30);
      IntervalTree(pIVar7,(intervalVector *)
                          &rights.
                           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,depth_00,minbucket,
                   rightp,(unsigned_long)
                          stops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0x200);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
      ::
      unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>,void>
                ((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
                  *)&local_140,pIVar7);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::operator=(&this->left,&local_140);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::~unique_ptr(&local_140);
    }
    bVar1 = std::
            vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
            ::empty((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)&i);
    if (!bVar1) {
      pIVar7 = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)operator_new(0x30);
      IntervalTree(pIVar7,(intervalVector *)&i,depth_00,minbucket,
                   (unsigned_long)
                   stops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,centerp,0x200);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
      ::
      unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>,void>
                ((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
                  *)&local_148,pIVar7);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::operator=(&this->right,&local_148);
      std::
      unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::~unique_ptr(&local_148);
    }
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               *)&i);
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               *)&rights.
                  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

IntervalTree<T,K>(
            intervalVector& ivals,
            std::size_t depth = 16,
            std::size_t minbucket = 64,
            K leftextent = 0,
            K rightextent = 0,
            std::size_t maxbucket = 512
            )
        : left(nullptr)
        , right(nullptr)
    {

        --depth;
        IntervalStartSorter<T,K> intervalStartSorter;
        if (depth == 0 || (ivals.size() < minbucket && ivals.size() < maxbucket)) {
            std::sort(ivals.begin(), ivals.end(), intervalStartSorter);
            intervals = ivals;
        } else {
            if (leftextent == 0 && rightextent == 0) {
                // sort intervals by start
              std::sort(ivals.begin(), ivals.end(), intervalStartSorter);
            }

            K leftp = 0;
            K rightp = 0;
            K centerp = 0;

            if (leftextent || rightextent) {
                leftp = leftextent;
                rightp = rightextent;
            } else {
                leftp = ivals.front().start;
                std::vector<K> stops;
                stops.resize(ivals.size());
                transform(ivals.begin(), ivals.end(), stops.begin(), intervalStop<T,K>);
                rightp = *max_element(stops.begin(), stops.end());
            }

            //centerp = ( leftp + rightp ) / 2;
            centerp = ivals.at(ivals.size() / 2).start;
            center = centerp;

            intervalVector lefts;
            intervalVector rights;

            for (typename intervalVector::const_iterator i = ivals.begin(); i != ivals.end(); ++i) {
                const interval& interval = *i;
                if (interval.stop < center) {
                    lefts.push_back(interval);
                } else if (interval.start > center) {
                    rights.push_back(interval);
                } else {
                    intervals.push_back(interval);
                }
            }

            if (!lefts.empty()) {
                left = std::unique_ptr<intervalTree>(new intervalTree(lefts, depth, minbucket, leftp, centerp));
            }
            if (!rights.empty()) {
                right = std::unique_ptr<intervalTree>(new intervalTree(rights, depth, minbucket, centerp, rightp));
            }
        }
    }